

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O1

int parseChunkLine(CircularBuffer *buf,int *len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char length_str [40];
  char local_48 [48];
  
  iVar1 = JetHead::CircularBuffer::getLength(buf);
  if (iVar1 == 0) {
    return -1;
  }
  iVar1 = JetHead::CircularBuffer::byteAt(buf,0);
  if (iVar1 < 0) {
    return iVar1;
  }
  lVar3 = 0;
  while ((iVar1 != 0xd && (iVar1 != 0x3b))) {
    local_48[lVar3] = (char)iVar1;
    lVar3 = lVar3 + 1;
    iVar1 = JetHead::CircularBuffer::byteAt(buf,(int)lVar3);
    if (iVar1 < 0) {
      return iVar1;
    }
  }
  local_48[lVar3] = '\0';
  iVar2 = (int)lVar3 + 2;
  do {
    if (iVar1 == 0xd) {
      iVar1 = JetHead::CircularBuffer::byteAt(buf,iVar2 + -1);
      if (iVar1 != 10) {
        return -1;
      }
      lVar3 = strtol(local_48,(char **)0x0,0x10);
      *len = (int)lVar3;
      return iVar2;
    }
    iVar1 = JetHead::CircularBuffer::byteAt(buf,iVar2 + -1);
    iVar2 = iVar2 + 1;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

int parseChunkLine( const CircularBuffer &buf, int &len )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	char length_str[ 40 ];
	int i = 0;
	int j = 0;
	int c;

	if (!buf.getLength())
		return -1;
				
	while ( 1 )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;

		if ( c == ';' || c == '\r')
			break;
		length_str[ j++ ] = c;
	}

	length_str[ j ] = 0;

	while ( c != '\r' )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;
	}
	
	// if CRLF move past LF
	c = buf.byteAt(i);
	if ( c == '\n' )
		i++;
	else
		return -1;
		
	len = strtol( length_str, NULL, 16 );

	LOG( "string %s", length_str );
	return i;
}